

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAPSFile.cpp
# Opt level: O3

int __thiscall CAPSFile::CreateData(CAPSFile *this,IDisk *disk,int side,uint tr,int datakey)

{
  pointer *ppaVar1;
  pointer *ppaVar2;
  undefined4 uVar3;
  MFMTrack *pMVar4;
  iterator __position;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined8 uVar9;
  EncoderSpsBlockDescriptor EVar10;
  uchar *puVar11;
  byte bVar12;
  uchar byte;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  uchar *puVar18;
  undefined4 extraout_var;
  uchar *puVar19;
  uint uVar20;
  size_t __n;
  long lVar21;
  size_t __n_00;
  int nb_byte_to_add;
  iterator it;
  Side *pSVar22;
  undefined8 *puVar23;
  ulong uVar24;
  undefined4 *puVar25;
  CAPSFile *pCVar26;
  iterator __position_00;
  uint uVar27;
  uint *puVar28;
  int nb_byte_to_add_00;
  byte bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  vector<CAPSFile::BlockDescriptor,_std::allocator<CAPSFile::BlockDescriptor>_>
  list_block_descriptor;
  StreamRecording gap_data;
  StreamRecording data;
  uchar pattern_byte [16];
  int local_168;
  int local_164;
  undefined1 local_148 [16];
  anon_struct_32_7_d903e6a6 *local_138;
  Side *local_130;
  StreamRecording local_128;
  int local_118;
  int local_114;
  uint local_110;
  int local_10c;
  anon_struct_32_7_d903e6a6 local_108;
  StreamRecording local_e0;
  CAPSFile *local_d0;
  anon_struct_36_6_d3f54bdf local_c8;
  undefined1 local_98 [28];
  undefined1 local_7c [16];
  undefined1 local_6c [16];
  undefined1 local_5c [16];
  uchar local_4c [4];
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  ulong local_38;
  
  bVar29 = 0;
  local_e0.offset = 0;
  local_110 = datakey;
  local_e0.buffer = (uchar *)operator_new__(0x80);
  local_e0.size = 0x80;
  local_128.offset = 0;
  local_128.buffer = (uchar *)operator_new__(0x80);
  local_128.size = 0x80;
  local_148 = (undefined1  [16])0x0;
  local_138 = (anon_struct_32_7_d903e6a6 *)0x0;
  local_4c[0] = '\0';
  local_4c[1] = '\0';
  local_4c[2] = '\0';
  local_4c[3] = '\0';
  local_c8.header.type[0] = '\0';
  local_c8.header.type[1] = '\0';
  local_c8.header.type[2] = '\0';
  local_c8.header.type[3] = '\0';
  local_c8.header.length = 0;
  local_c8.header.crc = 0;
  local_c8.size = 0;
  auVar31 = (undefined1  [16])local_c8._0_16_;
  local_c8.header.crc = 0;
  local_c8.size = 0;
  local_c8.bit_size = 0;
  local_c8.data_crc = 0;
  local_c8.data_id = 0;
  local_c8.buffer._0_4_ = 0;
  local_c8.buffer._4_4_ = 0;
  local_98[0] = 'I';
  local_98[1] = 'M';
  local_98[2] = 'G';
  local_98[3] = 'E';
  local_98._4_4_ = 0x50;
  local_98._8_4_ = 0;
  local_98._20_4_ = 2;
  local_98._24_4_ = 1;
  local_7c = (undefined1  [16])0x0;
  local_6c = (undefined1  [16])0x0;
  local_5c = (undefined1  [16])0x0;
  local_d0 = this;
  local_98._12_4_ = tr;
  local_98._16_4_ = side;
  if ((side < (int)(uint)disk->nb_sides_) && (tr < disk->side_[side].nb_tracks)) {
    pMVar4 = disk->side_[side].tracks;
    puVar18 = pMVar4[tr].bitfield;
    if (puVar18 == (uchar *)0x0) goto LAB_0012fe73;
    local_c8._0_16_ = auVar31;
    uVar14 = FindNextPattern(puVar18,pMVar4[tr].size,0,"R$R$R$",6);
    local_130 = disk->side_ + side;
    if (uVar14 != 0xffffffff) {
LAB_0012fab0:
      auVar31 = local_7c;
      local_7c._8_4_ = uVar14;
      local_7c._0_4_ = auVar31._0_4_;
      local_7c._4_4_ = uVar14 >> 3;
      pMVar4 = local_130->tracks;
      puVar18 = (uchar *)operator_new__((ulong)pMVar4[tr].size);
      puVar28 = &pMVar4[tr].size;
      memcpy(puVar18,pMVar4[tr].bitfield + uVar14,(ulong)(*puVar28 - uVar14));
      memcpy(puVar18 + (*puVar28 - uVar14),pMVar4[tr].bitfield,(ulong)uVar14);
      iVar16 = 0;
      local_114 = 0;
      if (*puVar28 != 0x10) {
        uVar14 = *puVar28 - 0x11;
        local_114 = 0;
        do {
          if ((*(long *)(puVar18 + (uVar14 + 1)) != 0x1000100010001 ||
               *(long *)(puVar18 + (ulong)(uVar14 + 1) + 8) != 0x1000100010001) ||
             (puVar18[uVar14] == '\x01')) break;
          local_114 = local_114 + 1;
          uVar14 = uVar14 - 0x10;
        } while (uVar14 != 0xffffffff);
      }
      local_118 = local_114 << 4;
      local_164 = 0;
      iVar17 = 0;
      local_168 = 0;
      uVar24 = 0;
      pSVar22 = local_130;
      do {
        local_108.block_bits = 0;
        local_108.gap_bits = 0;
        local_108.sps_specific.cell_type = 0;
        local_108.encoder_type = 0;
        local_108.block_flag = 0;
        local_108.gap_value = 0;
        local_108.data_offset = local_e0.offset;
        local_108.sps_specific.gap_offset = local_128.offset;
        uVar14 = (uint)uVar24;
        uVar15 = FindNextSector(puVar18,pSVar22->tracks[tr].size,uVar14 + 1,8);
        local_38 = CONCAT44(extraout_var,uVar15);
        if (uVar15 == 0xffffffff) {
          uVar24 = (ulong)((pSVar22->tracks[tr].size - local_118) - 0x10);
          nb_byte_to_add = local_114;
        }
        else {
          uVar27 = uVar15 - 0x10;
          nb_byte_to_add = 0;
          if (uVar14 < uVar27) {
            nb_byte_to_add = 0;
            uVar15 = uVar15 - 0x11;
            do {
              uVar20 = uVar15;
              uVar24 = (ulong)(uVar20 + 1);
              if (*(long *)(puVar18 + uVar24) != 0x1000100010001 ||
                  *(long *)(puVar18 + uVar24 + 8) != 0x1000100010001) goto LAB_0012fc3a;
              if (puVar18[uVar20] == '\x01') goto LAB_0012fc5b;
              nb_byte_to_add = nb_byte_to_add + 1;
              uVar27 = uVar27 - 0x10;
              uVar15 = uVar20 - 0x10;
            } while (uVar14 < uVar20 - 0xf);
            uVar24 = (ulong)(uVar20 - 0xf);
          }
          else {
LAB_0012fc3a:
            uVar24 = (ulong)uVar27;
          }
        }
LAB_0012fc5b:
        uVar15 = (uint)uVar24;
        _local_48 = *(_func_int ***)(puVar18 + (int)uVar15);
        _uStack_40 = *(undefined8 *)(puVar18 + (int)uVar15 + 8);
        local_10c = iVar16;
        iVar16 = (*local_d0->_vptr_CAPSFile[10])(local_d0,&stack0xffffffffffffffb8,0x10);
        nb_byte_to_add_00 = 0;
        if ((char)iVar16 == '\x01' && uVar14 < uVar15) {
          nb_byte_to_add_00 = 0;
          do {
            uVar15 = (uint)uVar24;
            puVar19 = puVar18 + uVar24;
            auVar31[0] = -(*puVar19 == local_48);
            auVar31[1] = -(puVar19[1] == uStack_47);
            auVar31[2] = -(puVar19[2] == uStack_46);
            auVar31[3] = -(puVar19[3] == uStack_45);
            auVar31[4] = -(puVar19[4] == uStack_44);
            auVar31[5] = -(puVar19[5] == uStack_43);
            auVar31[6] = -(puVar19[6] == uStack_42);
            auVar31[7] = -(puVar19[7] == uStack_41);
            auVar31[8] = -(puVar19[8] == uStack_40);
            auVar31[9] = -(puVar19[9] == uStack_3f);
            auVar31[10] = -(puVar19[10] == uStack_3e);
            auVar31[0xb] = -(puVar19[0xb] == uStack_3d);
            auVar31[0xc] = -(puVar19[0xc] == uStack_3c);
            auVar31[0xd] = -(puVar19[0xd] == uStack_3b);
            auVar31[0xe] = -(puVar19[0xe] == uStack_3a);
            auVar31[0xf] = -(puVar19[0xf] == uStack_39);
            if ((((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar31[0xf] >> 7) << 0xf) != 0xffff) ||
                (((bVar12 = puVar18[uVar15 - 1] & puVar18[uVar24], uVar14 < uVar15 - 1 &&
                  (bVar12 == 1)) || ((puVar18[uVar15 + 1] & bVar12) != 1)))) ||
               ((1 < uVar15 && ((bVar12 & puVar18[uVar15 - 2]) != 1)))) break;
            uVar15 = uVar15 - 0x10;
            uVar24 = (ulong)uVar15;
            nb_byte_to_add_00 = nb_byte_to_add_00 + 1;
          } while (uVar14 < uVar15);
        }
        pCVar26 = (CAPSFile *)&stack0xffffffffffffffb8;
        byte = IDisk::ConvertMFMToByte((uchar *)pCVar26);
        AddGapRecord(pCVar26,&local_128,nb_byte_to_add_00,byte);
        local_108.gap_bits = local_108.gap_bits + nb_byte_to_add_00 * 0x10;
        if (nb_byte_to_add != 0) {
          AddGapRecord(pCVar26,&local_128,nb_byte_to_add,'\0');
          local_108.gap_bits = local_108.gap_bits + nb_byte_to_add * 0x10;
          local_168 = local_168 + nb_byte_to_add * 0x10;
          iVar17 = iVar17 + nb_byte_to_add * 2;
          local_108.block_flag = local_108.block_flag | 2;
        }
        pSVar22 = local_130;
        local_168 = local_168 + nb_byte_to_add_00 * 0x10;
        local_6c._0_4_ = local_168;
        iVar17 = iVar17 + nb_byte_to_add_00 * 2;
        local_7c._0_4_ = iVar17;
        if (nb_byte_to_add_00 != 0) {
          local_108.block_flag = local_108.block_flag | 1;
        }
        bVar13 = AddStreamRecord(pCVar26,&local_e0,puVar18,uVar14,uVar15 + 0x10,
                                 local_130->tracks[tr].size);
        local_108.block_bits = (uVar15 + 0x10) - uVar14;
        local_164 = local_164 + local_108.block_bits;
        local_7c._12_4_ = local_164;
        iVar17 = iVar17 + (local_108.block_bits + 7 >> 3);
        local_7c._0_4_ = iVar17;
        local_108.sps_specific.cell_type = 1;
        local_108.encoder_type = 1;
        if (!bVar13) {
          local_108.block_flag = local_108.block_flag | 4;
        }
        local_108.gap_value = 0x4e;
        if ((anon_struct_32_7_d903e6a6 *)local_148._8_8_ == local_138) {
          std::vector<CAPSFile::BlockDescriptor,std::allocator<CAPSFile::BlockDescriptor>>::
          _M_realloc_insert<CAPSFile::BlockDescriptor_const&>
                    ((vector<CAPSFile::BlockDescriptor,std::allocator<CAPSFile::BlockDescriptor>> *)
                     local_148,(iterator)local_148._8_8_,&local_108);
        }
        else {
          EVar10.cell_type = 1;
          EVar10.gap_offset = local_108.sps_specific.gap_offset;
          *(ulong *)(local_148._8_8_ + 0x10) = CONCAT44(local_108.block_flag,1);
          *(ulong *)(local_148._8_8_ + 0x18) = CONCAT44(local_108.data_offset,0x4e);
          *(ulong *)local_148._8_8_ = CONCAT44(local_108.gap_bits,local_108.block_bits);
          *(EncoderSpsBlockDescriptor *)(local_148._8_8_ + 8) = EVar10;
          local_148._8_8_ = (anon_struct_32_7_d903e6a6 *)(local_148._8_8_ + 0x20);
        }
        iVar16 = local_10c + 1;
        local_6c._8_4_ = iVar16;
        uVar24 = local_38 & 0xffffffff;
      } while ((int)local_38 != -1);
      operator_delete__(puVar18);
      __n_00 = (size_t)local_128.offset;
      __n = (size_t)local_e0.offset;
      goto LAB_0012fe89;
    }
    uVar14 = FindNextSector(puVar18,local_130->tracks[tr].size,0,8);
    if (uVar14 != 0xffffffff) goto LAB_0012fab0;
    local_7c._8_4_ = 0;
    local_98._20_4_ = 1;
  }
  else {
LAB_0012fe73:
    local_98._20_4_ = 1;
    local_98._24_4_ = 1;
  }
  local_164 = 0;
  local_168 = 0;
  __n = 0;
  __n_00 = 0;
LAB_0012fe89:
  builtin_memcpy(local_c8.header.type,"DATA",4);
  local_c8.header.length = 0x1c;
  puVar23 = (undefined8 *)local_148._0_8_;
  uVar9 = local_148._8_8_;
  uVar14 = local_148._8_4_ - local_148._0_4_ & 0xffffffe0;
  iVar16 = (int)__n_00 + uVar14;
  uVar15 = (int)__n + iVar16;
  local_c8.size = uVar15;
  local_c8.bit_size = uVar15 * 8;
  puVar19 = (uchar *)operator_new__((ulong)uVar15);
  puVar18 = local_128.buffer;
  local_c8.buffer._0_4_ = SUB84(puVar19,0);
  local_c8.buffer._4_4_ = (undefined4)((ulong)puVar19 >> 0x20);
  if (puVar23 != (undefined8 *)uVar9) {
    lVar21 = 0;
    do {
      *(uint *)(puVar23 + 1) = *(int *)(puVar23 + 1) + uVar14;
      *(int *)((long)puVar23 + 0x1c) = *(int *)((long)puVar23 + 0x1c) + iVar16;
      lVar21 = (long)(int)lVar21;
      uVar9 = puVar23[3];
      *(undefined8 *)(puVar19 + lVar21 + 0x10) = puVar23[2];
      *(undefined8 *)(puVar19 + lVar21 + 0x10 + 8) = uVar9;
      uVar9 = puVar23[1];
      *(undefined8 *)(puVar19 + lVar21) = *puVar23;
      *(undefined8 *)(puVar19 + lVar21 + 8) = uVar9;
      uVar24 = 0xfffffffffffffffc;
      do {
        uVar3 = *(undefined4 *)(puVar19 + uVar24 + lVar21 + 4);
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             (ulong)CONCAT52((int5)(CONCAT43((int)(CONCAT34((int3)(CONCAT25((short)(((uint7)(byte)((
                                                  uint)uVar3 >> 0x18) << 0x30) >> 0x28),
                                                  CONCAT14((char)((uint)uVar3 >> 0x10),uVar3)) >>
                                                  0x20),uVar3) >> 0x18),
                                             CONCAT12((char)((uint)uVar3 >> 8),(short)uVar3)) >>
                                   0x10),(short)uVar3) & 0xffff00ff00ff00ff;
        auVar31 = pshuflw(auVar30,auVar30,0x1b);
        sVar5 = auVar31._0_2_;
        sVar6 = auVar31._2_2_;
        sVar7 = auVar31._4_2_;
        sVar8 = auVar31._6_2_;
        *(uint *)(puVar19 + uVar24 + lVar21 + 4) =
             CONCAT13((0 < sVar8) * (sVar8 < 0x100) * auVar31[6] - (0xff < sVar8),
                      CONCAT12((0 < sVar7) * (sVar7 < 0x100) * auVar31[4] - (0xff < sVar7),
                               CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar31[2] - (0xff < sVar6),
                                        (0 < sVar5) * (sVar5 < 0x100) * auVar31[0] - (0xff < sVar5))
                              ));
        uVar24 = uVar24 + 4;
      } while (uVar24 < 0x1c);
      lVar21 = lVar21 + 0x20;
      puVar23 = puVar23 + 4;
    } while (puVar23 != (undefined8 *)local_148._8_8_);
  }
  memcpy(puVar19 + (int)uVar14,local_128.buffer,__n_00);
  puVar11 = local_e0.buffer;
  memcpy(puVar19 + iVar16,local_e0.buffer,__n);
  local_5c._4_4_ = local_110;
  local_c8.data_id = local_110;
  local_c8.data_crc = CRC::ComputeCrc32(0xedb88320,puVar19,uVar15);
  pCVar26 = local_d0;
  local_6c._4_4_ = local_164 + local_168;
  uVar14 = CRC::ComputeCrc32(0xedb88320,local_98,0x50);
  local_98._8_4_ =
       uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
  __position_00._M_current =
       (pCVar26->list_imge_).
       super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position_00._M_current ==
      (pCVar26->list_imge_).
      super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CAPSFile::ImgeItem,std::allocator<CAPSFile::ImgeItem>>::
    _M_realloc_insert<CAPSFile::ImgeItem_const&>
              ((vector<CAPSFile::ImgeItem,std::allocator<CAPSFile::ImgeItem>> *)&pCVar26->list_imge_
               ,__position_00,(anon_struct_80_16_0595f1fa *)local_98);
  }
  else {
    puVar25 = (undefined4 *)local_98;
    for (lVar21 = 0x14; lVar21 != 0; lVar21 = lVar21 + -1) {
      *(undefined4 *)((__position_00._M_current)->header).type = *puVar25;
      puVar25 = puVar25 + (ulong)bVar29 * -2 + 1;
      __position_00._M_current = __position_00._M_current + (ulong)bVar29 * -8 + 4;
    }
    ppaVar1 = &(pCVar26->list_imge_).
               super__Vector_base<CAPSFile::ImgeItem,_std::allocator<CAPSFile::ImgeItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  auVar31 = (undefined1  [16])local_c8._0_16_;
  __position._M_current =
       (pCVar26->list_data_).
       super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (pCVar26->list_data_).
      super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<CAPSFile::DataChunks,std::allocator<CAPSFile::DataChunks>>::
    _M_realloc_insert<CAPSFile::DataChunks_const&>
              ((vector<CAPSFile::DataChunks,std::allocator<CAPSFile::DataChunks>> *)
               &pCVar26->list_data_,__position,&local_c8);
  }
  else {
    *(undefined4 *)((long)&(__position._M_current)->buffer + 4) = local_c8.buffer._4_4_;
    (__position._M_current)->bit_size = local_c8.bit_size;
    (__position._M_current)->data_crc = local_c8.data_crc;
    *(ulong *)&(__position._M_current)->data_id = CONCAT44(local_c8.buffer._0_4_,local_c8.data_id);
    ((__position._M_current)->header).type[0] = local_c8.header.type[0];
    ((__position._M_current)->header).type[1] = local_c8.header.type[1];
    ((__position._M_current)->header).type[2] = local_c8.header.type[2];
    ((__position._M_current)->header).type[3] = local_c8.header.type[3];
    ((__position._M_current)->header).length = local_c8.header.length;
    *(undefined8 *)&((__position._M_current)->header).crc = local_c8._8_8_;
    ppaVar2 = &(pCVar26->list_data_).
               super__Vector_base<CAPSFile::DataChunks,_std::allocator<CAPSFile::DataChunks>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppaVar2 = *ppaVar2 + 1;
    local_c8._0_16_ = auVar31;
  }
  if (puVar11 != (uchar *)0x0) {
    operator_delete__(puVar11);
  }
  if (puVar18 != (uchar *)0x0) {
    operator_delete__(puVar18);
  }
  if ((void *)local_148._0_8_ != (void *)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  return 0;
}

Assistant:

int CAPSFile::CreateData(IDisk* disk, int side, unsigned int tr, int datakey)
{
   // Create IMGE and data structure
   ImgeItem imge_item;
   DataChunks data_chunk;

   bool abort = false;

   StreamRecording gap_data;
   StreamRecording data;
   data.offset = 0;
   data.buffer = new unsigned char[128];
   data.size = 128;

   gap_data.offset = 0;
   gap_data.buffer = new unsigned char[128];
   gap_data.size = 128;

   int gap_offset = 0;
   //unsigned char* pData = new unsigned char[128];
   int max_size_data = 128;

   // Block descriptor vector
   std::vector<BlockDescriptor> list_block_descriptor;


   memset(&imge_item, 0, sizeof(imge_item));
   memset(&data_chunk, 0, sizeof(data_chunk));

   // &disk->m_Disk[side].Tracks[tr]);

   ////////////
   // IMGE
   memcpy(imge_item.header.type, "IMGE", 4);
   imge_item.header.crc = 0;
   imge_item.header.length = 0x50;
   imge_item.track_number = tr;
   imge_item.side = side;
   imge_item.density = 2; // auto
   imge_item.signal_type = 1; // 2us cell
   imge_item.track_byte = 0; //
   imge_item.start_byte_pos = 0;
   imge_item.start_bit_pos = 0;
   imge_item.data_bits = 0;
   imge_item.gap_bits = 0;
   imge_item.track_bits = 0;
   imge_item.block_count = 0;
   imge_item.encoder_process = 0; // 0
   imge_item.track_flags = 0;
   imge_item.data_key = 0;

   // Nothing on this side / track ?
   if (side >= disk->nb_sides_ || tr >= disk->side_[side].nb_tracks)
   {
      imge_item.start_bit_pos = 0;
      imge_item.density = 1;
      abort = true;
      //goto End;//return 0;
   }

   unsigned char* track_field = nullptr;
   if (!abort)
   {
      track_field = disk->side_[side].tracks[tr].bitfield;
      // DATA
      if (track_field == NULL)
      {
         imge_item.start_bit_pos = 0;
         imge_item.density = 1;
         abort = true;
         //goto End;//return 0;
      }
   }

   unsigned int startbitpos = 0;
   // Construct DATA associated :
   // Find begining of track

   // Find the 0x5224 0x5224 0x5224  first sync
   unsigned int search_offset = 0;
   unsigned int current_recored_offset = 0;

   unsigned char pattern_byte[16];

   if (!abort)
   {
      // Only search the 3 x 0x5224 bytes
      search_offset = FindNextPattern(track_field, disk->side_[side].tracks[tr].size, search_offset, pPatternC2, 6);
      if (search_offset != -1)
      {
         imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
         imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
      }
      else
      {
         search_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size, search_offset + 1, 8);
         if (search_offset != -1)
         {
            imge_item.start_bit_pos = (search_offset != -1) ? search_offset : 0;
            imge_item.start_byte_pos = imge_item.start_bit_pos / 8;
         }
         else
         {
            // Not a formatted disk : Generate random data
            imge_item.start_bit_pos = 0;
            imge_item.density = 1;
            int dbg = 1;
            //goto End;
            abort = true;
         }
      }
   }

   if (!abort)
   {
      track_field = new unsigned char[disk->side_[side].tracks[tr].size];
      memcpy(track_field, &disk->side_[side].tracks[tr].bitfield[imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].size - imge_item.start_bit_pos);
      memcpy(&track_field[disk->side_[side].tracks[tr].size - imge_item.start_bit_pos],
             disk->side_[side].tracks[tr].bitfield, imge_item.start_bit_pos);

      search_offset = 0;
      int initial_backward_gap = 0;
      unsigned int offset_gap = disk->side_[side].tracks[tr].size - 16;
      while ((offset_gap > current_recored_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
         && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
      )
      {
         offset_gap -= 16;
         initial_backward_gap++;
      }

      while (search_offset != -1)
      {
         int nb_backward_gap_bytes = 0;
         // Add it : Descriptor, and data
         BlockDescriptor block_descriptor;
         memset(&block_descriptor, 0, sizeof(block_descriptor));

         block_descriptor.block_flag = 0;
         block_descriptor.data_offset = data.offset;
         block_descriptor.sps_specific.gap_offset = gap_data.offset;


         unsigned int search_next_offset = FindNextSector(track_field, disk->side_[side].tracks[tr].size,
                                                          search_offset + 1, 8);
         int end_of_block = 0;
         if (search_next_offset != -1)
         {
            // Next block found : Dont use the '0x00' sync bytes before it - It's the 'backward' gap
            unsigned int offset_gap = search_next_offset - 16;
            nb_backward_gap_bytes = 0;
            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pPattern00, 16) == 0)
               && (offset_gap < 1 || track_field[offset_gap - 1] != 1)
            )
            {
               offset_gap -= 16;
               nb_backward_gap_bytes++;
            }
            end_of_block = offset_gap + 16;
         }
         else
         {
            // End block : until the end, then until IMGEitem.start_bit_pos
            nb_backward_gap_bytes = initial_backward_gap;
            end_of_block = disk->side_[side].tracks[tr].size - nb_backward_gap_bytes * 16;
         }

         // What to record : From the next block, until it changed, record the "forward gap"
         memcpy(pattern_byte, &track_field[end_of_block - 16], 16);
         int nb_gap_bytes = 0;
         unsigned int offset_gap = end_of_block - 16;

         // Only if no weak bits in the pattern !
         if (NoWeakBitInPattern(pattern_byte, 16))
         {
            if (pattern_byte[0] == 0
               && pattern_byte[15] == 0
               && (pattern_byte[14] & pattern_byte[1]) == 0
            )
            {
               int dbg = 1;
            }

            while ((offset_gap > search_offset && memcmp(&track_field[offset_gap], pattern_byte, 16) == 0)
               && (((track_field[offset_gap] & track_field[offset_gap - 1]) != 1) || offset_gap - 1 <= search_offset)
               && (offset_gap < 1 || ((track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap +
                     1]) == 1)
                  && (offset_gap < 2 || (track_field[offset_gap - 1] & track_field[offset_gap] & track_field[offset_gap
                     - 2]) == 1)
               )
            )
            {
               offset_gap -= 16;
               nb_gap_bytes++;
            }
         }
         offset_gap += 16;
         // pPatternByte -> signel byte
         unsigned char byte = IDisk::ConvertMFMToByte(pattern_byte);
         {
            AddGapRecord(&gap_data, nb_gap_bytes, byte);
            block_descriptor.gap_bits += nb_gap_bytes * 16;
            if (nb_backward_gap_bytes > 0)
            {
               AddGapRecord(&gap_data, nb_backward_gap_bytes, 0x00);
               block_descriptor.gap_bits += nb_backward_gap_bytes * 16;
               imge_item.gap_bits += 16 * nb_backward_gap_bytes;
               imge_item.track_byte += nb_backward_gap_bytes * 2;
               block_descriptor.block_flag |= 2;
            }


            imge_item.gap_bits += 16 * nb_gap_bytes;
            imge_item.track_byte += nb_gap_bytes * 2;
            if (nb_gap_bytes > 0)
               block_descriptor.block_flag |= 1;

            // TODO : Adjust at bit value
            // data itself : Add the data (supposed to pPatternC2 + 16 bits (FC most of the time)
            // From searchOffset -> offsetGap;
            bool byte_size = AddStreamRecord(&data, track_field, search_offset, offset_gap,
                                             disk->side_[side].tracks[tr].size);
            imge_item.data_bits += (offset_gap - search_offset);
            imge_item.track_byte += (offset_gap - search_offset + 7) / 8;

            // Block descriptor : End the description
            block_descriptor.block_bits = (offset_gap - search_offset);
            block_descriptor.sps_specific.cell_type = 1;
            block_descriptor.encoder_type = 1;

            if (!byte_size)
               block_descriptor.block_flag |= 4; // in byte. TODO : Use value for bits
            block_descriptor.gap_value = 0x4E;

            list_block_descriptor.push_back(block_descriptor);
            imge_item.block_count++;

            search_offset = search_next_offset;
         }

         // Next blocks
      }

      delete[]track_field;
   }
   // End of track (or unformatted ones !)
   // TODO
   //End:

   // End : Now compile every descriptor, then every datas ( ).
   // dataoffset and gapoffsets
   memcpy(data_chunk.header.type, "DATA", 4);
   data_chunk.header.length = sizeof (data_chunk) - sizeof (unsigned char*); //+ listBlockDescriptor.size() * sizeof(tBlockDescriptor);
   //dataChunk.header.Length += data.Offset + gapData.Offset;
   data_chunk.size = list_block_descriptor.size() * sizeof(BlockDescriptor);
   int final_gap_offset = data_chunk.size;
   int final_data_offset = final_gap_offset + gap_data.offset;

   data_chunk.size += gap_data.offset;
   data_chunk.size += data.offset;
   data_chunk.bit_size = data_chunk.size * 8;

   // Now compile DATA chunks into a buffer
   data_chunk.buffer = new unsigned char[data_chunk.size];
   int final_offset = 0;

   for (std::vector<BlockDescriptor>::iterator it = list_block_descriptor.begin(); it != list_block_descriptor.end(); it
        ++)
   {
      // Adjust gap offset
      it->sps_specific.gap_offset += final_gap_offset;
      // Adjust data offset
      it->data_offset += final_data_offset;

      // Copy block descriptor
      memcpy(&data_chunk.buffer[final_offset], &(*it), sizeof(BlockDescriptor));
      Swap(&data_chunk.buffer[final_offset], sizeof(BlockDescriptor));
      final_offset += sizeof(BlockDescriptor);
   }
   memcpy(&data_chunk.buffer[final_gap_offset], gap_data.buffer, gap_data.offset);
   memcpy(&data_chunk.buffer[final_data_offset], data.buffer, data.offset);

   data_chunk.data_id = imge_item.data_key = datakey;
   data_chunk.data_crc = CRC::ComputeCrc32(0xEDB88320, data_chunk.buffer, data_chunk.size);

   // Now, update IMGE
   imge_item.track_bits = imge_item.gap_bits + imge_item.data_bits;

   if (side < disk->nb_sides_ && tr < disk->side_[side].nb_tracks)
   {
      if (disk->side_[side].tracks[tr].size != imge_item.track_bits)
      {
         // error ?
         int dbg = 1;
      }
   }
   // .. To add

   // CRC
   imge_item.header.crc = SwapInt(CRC::ComputeCrc32(0xEDB88320, (unsigned char*)&imge_item, sizeof(imge_item)));

   list_imge_.push_back(imge_item);
   list_data_.push_back(data_chunk);

   delete []data.buffer;
   delete []gap_data.buffer;

   return 0;
}